

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  FieldType type;
  int number;
  bool bVar1;
  CppStringType CVar2;
  uint32_t uVar3;
  OneofDescriptor *pOVar4;
  Cord *pCVar5;
  Cord **ppCVar6;
  Nullable<const_char_*> failure_msg;
  InlinedStringField *pIVar7;
  ArenaStringPtr *pAVar8;
  char *description;
  Arena *pAVar9;
  Descriptor *pDVar10;
  pointer pcVar11;
  size_type sVar12;
  Metadata MVar13;
  string_view src;
  uint local_64;
  LogMessageFatal local_60;
  string local_50;
  
  MVar13 = Message::GetMetadata(message);
  if (MVar13.reflection != this) {
    pDVar10 = this->descriptor_;
    MVar13 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar10,MVar13.descriptor,field,"SetString");
  }
  pDVar10 = this->descriptor_;
  if (field->containing_type_ == pDVar10) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        CVar2 = FieldDescriptor::cpp_string_type(field);
        if ((CVar2 == kView) || (CVar2 == kString)) {
          bVar1 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
          if (!bVar1) {
            pOVar4 = FieldDescriptor::real_containing_oneof(field);
            if (pOVar4 != (OneofDescriptor *)0x0) {
              bVar1 = HasOneofField(this,message,field);
              if (!bVar1) {
                pOVar4 = FieldDescriptor::containing_oneof(field);
                ClearOneof(this,message,pOVar4);
                pAVar8 = MutableField<google::protobuf::internal::ArenaStringPtr>
                                   (this,message,field);
                (pAVar8->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
              }
            }
            pAVar8 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
            pAVar9 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar9 & 1) != 0) {
              pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
            }
            internal::ArenaStringPtr::Set(pAVar8,value,pAVar9);
            return;
          }
          local_60.super_LogMessage.errno_saver_.saved_errno_ =
               internal::ReflectionSchema::InlinedStringIndex(&this->schema_,field);
          local_64 = 0;
          failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                                  ((uint *)&local_60,&local_64,"index > 0u");
          if (failure_msg != (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                       ,0x810,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_60);
          }
          MutableInlinedStringDonatedArray(this,message);
          pIVar7 = MutableField<google::protobuf::internal::InlinedStringField>(this,message,field);
          pcVar11 = (value->_M_dataplus)._M_p;
          IsInlinedStringDonated(this,message,field);
          std::__cxx11::string::assign((char *)pIVar7,(ulong)pcVar11);
        }
        else if (CVar2 == kCord) {
          pOVar4 = FieldDescriptor::real_containing_oneof(field);
          if (pOVar4 == (OneofDescriptor *)0x0) {
            pcVar11 = (value->_M_dataplus)._M_p;
            sVar12 = value->_M_string_length;
            pCVar5 = MutableField<absl::lts_20250127::Cord>(this,message,field);
          }
          else {
            bVar1 = HasOneofField(this,message,field);
            if (!bVar1) {
              pOVar4 = FieldDescriptor::containing_oneof(field);
              ClearOneof(this,message,pOVar4);
              pAVar9 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
              if (((ulong)pAVar9 & 1) != 0) {
                pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
              }
              pCVar5 = Arena::Create<absl::lts_20250127::Cord>(pAVar9);
              ppCVar6 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
              *ppCVar6 = pCVar5;
            }
            pcVar11 = (value->_M_dataplus)._M_p;
            sVar12 = value->_M_string_length;
            ppCVar6 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
            pCVar5 = *ppCVar6;
          }
          src._M_str = pcVar11;
          src._M_len = sVar12;
          absl::lts_20250127::Cord::operator=(pCVar5,src);
          return;
        }
      }
      else {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        type = field->type_;
        std::__cxx11::string::string((string *)&local_50,(string *)value);
        internal::ExtensionSet::SetString
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),number,
                   type,&local_50,field);
        std::__cxx11::string::~string((string *)&local_50);
      }
      return;
    }
    pDVar10 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar10,field,"SetString",description);
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(
        field->number(), field->type(), std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
          break;
        }
        *MutableField<absl::Cord>(message, field) = value;
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          MutableField<InlinedStringField>(message, field)
              ->Set(value, message->GetArena(),
                    IsInlinedStringDonated(*message, field), states, mask,
                    message);
          break;
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          MutableField<MicroString>(message, field)
              ->Set(std::move(value), message->GetArena());
          break;
        }

        // Oneof string fields are never set as a default instance.
        // We just need to pass some arbitrary default string to make it work.
        // This allows us to not have the real default accessible from
        // reflection.
        if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->InitDefault();
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Set(std::move(value), message->GetArena());
        break;
      }
    }
  }
}